

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp-getelement.cpp
# Opt level: O0

IdentIndex ICM::insertGlobalDyVarbIdentIndex(string *name)

{
  IdentBasicIndex iid;
  size_t local_20;
  string *local_18;
  string *name_local;
  
  local_18 = name;
  local_20 = Common::
             SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]((SerialBijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)Compiler::GlobalIdentNameMap_abi_cxx11_,name);
  iid = insertFromIdentTable(0,&local_20,I_DyVarb);
  IdentIndex::IdentIndex((IdentIndex *)&name_local,0,iid);
  return (IdentIndex)name_local;
}

Assistant:

IdentIndex insertGlobalDyVarbIdentIndex(const string & name) {
		return { 0, insertFromIdentTable(0, Compiler::GlobalIdentNameMap[name], I_DyVarb) };
	}